

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_printer.cc
# Opt level: O0

void __thiscall LinePrinter::SetConsoleLocked(LinePrinter *this,bool locked)

{
  ulong uVar1;
  string local_70;
  allocator<char> local_39;
  string local_38;
  byte local_11;
  LinePrinter *pLStack_10;
  bool locked_local;
  LinePrinter *this_local;
  
  if (locked != (bool)(this->console_locked_ & 1U)) {
    local_11 = locked;
    pLStack_10 = this;
    if (locked) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
      PrintOnNewLine(this,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator(&local_39);
    }
    this->console_locked_ = (bool)(local_11 & 1);
    if ((local_11 & 1) == 0) {
      PrintOnNewLine(this,&this->output_buffer_);
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        std::__cxx11::string::string((string *)&local_70,(string *)&this->line_buffer_);
        Print(this,&local_70,this->line_type_);
        std::__cxx11::string::~string((string *)&local_70);
      }
      std::__cxx11::string::clear();
      std::__cxx11::string::clear();
    }
  }
  return;
}

Assistant:

void LinePrinter::SetConsoleLocked(bool locked) {
  if (locked == console_locked_)
    return;

  if (locked)
    PrintOnNewLine("");

  console_locked_ = locked;

  if (!locked) {
    PrintOnNewLine(output_buffer_);
    if (!line_buffer_.empty()) {
      Print(line_buffer_, line_type_);
    }
    output_buffer_.clear();
    line_buffer_.clear();
  }
}